

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O1

void text_reporter_start_suite(TestReporter *reporter,char *name,int number_of_tests)

{
  undefined8 *puVar1;
  void *pvVar2;
  code *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  
  puVar1 = (undefined8 *)reporter->memo;
  reporter->passes = 0;
  reporter->failures = 0;
  reporter->exceptions = 0;
  reporter->skips = 0;
  reporter_start_test(reporter,name);
  iVar4 = get_breadcrumb_depth(reporter->breadcrumb);
  if (iVar4 == 1) {
    pvVar2 = reporter->options;
    if ((pvVar2 == (void *)0x0) ||
       ((*(char *)((long)pvVar2 + 1) == '\0' &&
        ((pvVar2 == (void *)0x0 || (*(char *)((long)pvVar2 + 2) == '\0')))))) {
      pcVar3 = (code *)*puVar1;
      pcVar5 = get_current_from_breadcrumb(reporter->breadcrumb);
      pcVar6 = "s";
      if (number_of_tests == 1) {
        pcVar6 = "";
      }
      (*pcVar3)("Running \"%s\" (%d test%s)...\n",pcVar5,number_of_tests,pcVar6);
    }
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void text_reporter_start_suite(TestReporter *reporter, const char *name,
        const int number_of_tests) {
    TextMemo *memo = (TextMemo *)reporter->memo;

    reporter->passes = 0;
    reporter->failures = 0;
    reporter->skips = 0;
    reporter->exceptions = 0;

    reporter_start_test(reporter, name);
    if (get_breadcrumb_depth((CgreenBreadcrumb *) reporter->breadcrumb) == 1) {
        if (!have_quiet_mode(reporter) && !inhibit_start_suite_message(reporter))
            memo->printer("Running \"%s\" (%d test%s)...\n",
                          get_current_from_breadcrumb((CgreenBreadcrumb *) reporter->breadcrumb),
                          number_of_tests,
                          number_of_tests==1?"":"s");
        fflush(stdout);
    }
}